

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O2

bool __thiscall rtb::Concurrency::Queue<int>::someoneSlowerThanMe(Queue<int> *this)

{
  int iVar1;
  _Rb_tree_iterator<std::pair<const_std::thread::id,_int>_> _Var2;
  mapped_type *pmVar3;
  key_type local_18;
  
  _Var2 = std::
          __max_element<std::_Rb_tree_iterator<std::pair<std::thread::id_const,int>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<std::thread::id,int>const&,std::pair<std::thread::id,int>const&)>>
                    ((this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left,(_Rb_tree_iterator<std::pair<const_std::thread::id,_int>_>)
                             &(this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header,
                     (_Iter_comp_iter<bool_(*)(const_std::pair<std::thread::id,_int>_&,_const_std::pair<std::thread::id,_int>_&)>
                      )0x103480);
  iVar1 = *(int *)&_Var2._M_node[1]._M_parent;
  local_18._M_thread = pthread_self();
  pmVar3 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&this->subscribersMissingRead_,&local_18);
  return *pmVar3 < iVar1;
}

Assistant:

bool Queue<T>::someoneSlowerThanMe() {
        int maxNoMsgToRead =
            std::max_element(subscribersMissingRead_.begin(), subscribersMissingRead_.end(), pred)
                ->second;

        if (maxNoMsgToRead > subscribersMissingRead_[std::this_thread::get_id()]) return true;

        return false;
    }